

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

void xmlOutputBufferWriteQuotedString(xmlOutputBufferPtr buf,xmlChar *string)

{
  xmlChar *pxVar1;
  long lVar2;
  char *data;
  
  if ((buf == (xmlOutputBufferPtr)0x0) || (buf->error != 0)) {
    return;
  }
  pxVar1 = xmlStrchr(string,'\"');
  if (pxVar1 == (xmlChar *)0x0) {
    data = "\"";
  }
  else {
    pxVar1 = xmlStrchr(string,'\'');
    if (pxVar1 != (xmlChar *)0x0) {
      data = "\"";
      xmlOutputBufferWrite(buf,1,"\"");
      do {
        lVar2 = 0;
        while( true ) {
          if (string[lVar2] == '\0') {
            if (lVar2 != 0) {
              xmlOutputBufferWrite(buf,(int)lVar2,(char *)string);
            }
            goto LAB_0015c65b;
          }
          if (string[lVar2] == '\"') break;
          lVar2 = lVar2 + 1;
        }
        if (lVar2 != 0) {
          xmlOutputBufferWrite(buf,(int)lVar2,(char *)string);
        }
        xmlOutputBufferWrite(buf,6,"&quot;");
        string = string + lVar2 + 1;
      } while( true );
    }
    data = "\'";
  }
  xmlOutputBufferWrite(buf,1,data);
  xmlOutputBufferWriteString(buf,(char *)string);
LAB_0015c65b:
  xmlOutputBufferWrite(buf,1,data);
  return;
}

Assistant:

void
xmlOutputBufferWriteQuotedString(xmlOutputBufferPtr buf,
                                 const xmlChar *string) {
    const xmlChar *cur, *base;

    if ((buf == NULL) || (buf->error))
        return;

    if (xmlStrchr(string, '\"')) {
        if (xmlStrchr(string, '\'')) {
	    xmlOutputBufferWrite(buf, 1, "\"");
            base = cur = string;
            while(*cur != 0){
                if(*cur == '"'){
                    if (base != cur)
                        xmlOutputBufferWrite(buf, cur - base,
                                             (const char *) base);
                    xmlOutputBufferWrite(buf, 6, "&quot;");
                    cur++;
                    base = cur;
                }
                else {
                    cur++;
                }
            }
            if (base != cur)
                xmlOutputBufferWrite(buf, cur - base, (const char *) base);
	    xmlOutputBufferWrite(buf, 1, "\"");
	}
        else{
	    xmlOutputBufferWrite(buf, 1, "'");
            xmlOutputBufferWriteString(buf, (const char *) string);
	    xmlOutputBufferWrite(buf, 1, "'");
        }
    } else {
        xmlOutputBufferWrite(buf, 1, "\"");
        xmlOutputBufferWriteString(buf, (const char *) string);
        xmlOutputBufferWrite(buf, 1, "\"");
    }
}